

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

Texture * rw::ps2::readNativeTexture(Stream *stream)

{
  FILE *pFVar1;
  bool bVar2;
  uint32 uVar3;
  char *pcVar4;
  Texture *this;
  Raster *raster_00;
  ulong *puVar5;
  Error local_c0;
  Error _e_6;
  uint64 tex1;
  Error _e_5;
  Error _e_4;
  StreamRasterExt streamExt;
  Error _e_3;
  Error _e_2;
  Texture *tex;
  Error _e_1;
  Error _e;
  Ps2Raster *natras;
  Raster *raster;
  uint32 fourcc;
  uint32 version;
  uint32 oldversion;
  uint32 length;
  Stream *stream_local;
  
  _oldversion = stream;
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    raster._0_4_ = Stream::readU32(_oldversion);
    if ((uint32)raster == 0x325350) {
      this = Texture::create((Raster *)0x0);
      if (this != (Texture *)0x0) {
        uVar3 = Stream::readU32(_oldversion);
        this->filterAddressing = uVar3;
        bVar2 = findChunk(_oldversion,2,&version,(uint32 *)0x0);
        if (bVar2) {
          (*_oldversion->_vptr_Stream[4])(_oldversion,this->name,(ulong)version);
          bVar2 = findChunk(_oldversion,2,&version,(uint32 *)0x0);
          if (bVar2) {
            (*_oldversion->_vptr_Stream[4])(_oldversion,this->mask,(ulong)version);
            fourcc = rw::version;
            bVar2 = findChunk(_oldversion,1,(uint32 *)0x0,(uint32 *)0x0);
            if (bVar2) {
              bVar2 = findChunk(_oldversion,1,(uint32 *)0x0,(uint32 *)((long)&raster + 4));
              if (bVar2) {
                (*_oldversion->_vptr_Stream[4])(_oldversion,&_e_4,0x40);
                noNewStyleRasters = (uint)(streamExt.height._2_2_ < 2);
                rw::version = raster._4_4_;
                raster_00 = Raster::create(_e_4.plugin,_e_4.code,streamExt.width,
                                           (uint)(ushort)streamExt.height,4);
                noNewStyleRasters = 0;
                rw::version = fourcc;
                this->raster = raster_00;
                puVar5 = (ulong *)((long)&raster_00->platform + (long)nativeRasterOffset);
                calcTEX1(raster_00,(uint64 *)&_e_6,this->filterAddressing & 0xf);
                streamExt._8_8_ = streamExt._8_8_ & 0xfff8001fffffc000;
                *puVar5 = streamExt._8_8_;
                *(undefined4 *)(puVar5 + 1) = (undefined4)streamExt.tex0;
                *(undefined1 *)((long)puVar5 + 0xe) = streamExt.tex0._4_1_;
                puVar5[2] = streamExt._24_8_;
                puVar5[3] = streamExt.miptbp1;
                *(undefined4 *)(puVar5 + 4) = (undefined4)streamExt.miptbp2;
                *(undefined4 *)((long)puVar5 + 0x24) = streamExt.miptbp2._4_4_;
                *(uint32 *)(puVar5 + 5) = streamExt.pixelSize;
                *(undefined2 *)((long)puVar5 + 0xc) = (undefined2)streamExt.paletteSize;
                calcTEX1(raster_00,(uint64 *)&_e_6,this->filterAddressing & 0xf);
                if (streamExt.height._2_2_ < 2) {
                  if (streamExt.height._2_2_ == 1) {
                    if ((*(byte *)((long)puVar5 + 0x2c) & 1) == 0) {
                      *(byte *)((long)puVar5 + 0x2c) = *(byte *)((long)puVar5 + 0x2c) | 2;
                    }
                  }
                  else if ((*(byte *)((long)puVar5 + 0x2c) & 1) == 0) {
                    *(byte *)((long)puVar5 + 0x2c) = *(byte *)((long)puVar5 + 0x2c) & 0xfd;
                  }
                }
                bVar2 = findChunk(_oldversion,1,&version,(uint32 *)0x0);
                if (bVar2) {
                  if (1 < streamExt.height._2_2_) {
                    (*_oldversion->_vptr_Stream[4])
                              (_oldversion,*(undefined8 *)raster_00->originalPixels,
                               (ulong)(uint)puVar5[4]);
                    (*_oldversion->_vptr_Stream[4])
                              (_oldversion,raster_00->palette + -0x50,
                               (ulong)*(uint *)((long)puVar5 + 0x24));
                    return this;
                  }
                  (*_oldversion->_vptr_Stream[4])(_oldversion,raster_00->pixels,(ulong)version);
                  return this;
                }
                local_c0.plugin = 0xb00;
                local_c0.code = 0x80000004;
                fprintf(_stderr,"%s:%d: ",
                        "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                        ,0x86e);
                pFVar1 = _stderr;
                pcVar4 = dbgsprint(0x80000004,"STRUCT");
                fprintf(pFVar1,"%s\n",pcVar4);
                setError(&local_c0);
              }
              else {
                tex1._0_4_ = 0xb00;
                tex1._4_4_ = 0x80000004;
                fprintf(_stderr,"%s:%d: ",
                        "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                        ,0x7fc);
                pFVar1 = _stderr;
                pcVar4 = dbgsprint(0x80000004,"STRUCT");
                fprintf(pFVar1,"%s\n",pcVar4);
                setError((Error *)&tex1);
              }
            }
            else {
              _e_5.plugin = 0xb00;
              _e_5.code = 0x80000004;
              fprintf(_stderr,"%s:%d: ",
                      "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                      ,0x7f8);
              pFVar1 = _stderr;
              pcVar4 = dbgsprint(0x80000004,"STRUCT");
              fprintf(pFVar1,"%s\n",pcVar4);
              setError(&_e_5);
            }
          }
          else {
            streamExt.totalSize = 0xb00;
            streamExt.mipmapVal = 0x80000004;
            fprintf(_stderr,"%s:%d: ",
                    "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                    ,0x7ef);
            pFVar1 = _stderr;
            pcVar4 = dbgsprint(0x80000004,"STRING");
            fprintf(pFVar1,"%s\n",pcVar4);
            setError((Error *)&streamExt.totalSize);
          }
        }
        else {
          _e_3.plugin = 0xb00;
          _e_3.code = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                  ,0x7ea);
          pFVar1 = _stderr;
          pcVar4 = dbgsprint(0x80000004,"STRING");
          fprintf(pFVar1,"%s\n",pcVar4);
          setError(&_e_3);
        }
        Texture::destroy(this);
      }
    }
    else {
      tex._0_4_ = 0xb00;
      tex._4_4_ = 0x80000006;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
              0x7e0);
      pFVar1 = _stderr;
      pcVar4 = dbgsprint(0x80000006,(ulong)(uint32)raster);
      fprintf(pFVar1,"%s\n",pcVar4);
      setError((Error *)&tex);
    }
  }
  else {
    _e_1.plugin = 0xb00;
    _e_1.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
            0x7db);
    pFVar1 = _stderr;
    pcVar4 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar4);
    setError(&_e_1);
  }
  return (Texture *)0x0;
}

Assistant:

Texture*
readNativeTexture(Stream *stream)
{
	uint32 length, oldversion, version;
	uint32 fourcc;
	Raster *raster;
	Ps2Raster *natras;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	fourcc = stream->readU32();
	if(fourcc != FOURCC_PS2){
		RWERROR((ERR_PLATFORM, fourcc));
		return nil;
	}
	Texture *tex = Texture::create(nil);
	if(tex == nil)
		return nil;

	// Texture
	tex->filterAddressing = stream->readU32();
	if(!findChunk(stream, ID_STRING, &length, nil)){
		RWERROR((ERR_CHUNK, "STRING"));
		goto fail;
	}
	stream->read8(tex->name, length);
	if(!findChunk(stream, ID_STRING, &length, nil)){
		RWERROR((ERR_CHUNK, "STRING"));
		goto fail;
	}
	stream->read8(tex->mask, length);

	// Raster
	StreamRasterExt streamExt;
	oldversion = rw::version;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		goto fail;
	}
	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		goto fail;
	}
	ASSERTLITTLE;
	stream->read8(&streamExt, 0x40);
/*
printf("%X %X %X %X %X %016llX %X %X %016llX %016llX %X %X %X %X\n",
streamExt.width,
streamExt.height,
streamExt.depth,
streamExt.rasterFormat,
streamExt.version,
streamExt.tex0,
streamExt.paletteOffset,
streamExt.tex1low,
streamExt.miptbp1,
streamExt.miptbp2,
streamExt.pixelSize,
streamExt.paletteSize,
streamExt.totalSize,
streamExt.mipmapVal);
*/
	noNewStyleRasters = streamExt.version < 2;
	rw::version = version;
	raster = Raster::create(streamExt.width, streamExt.height,
	                        streamExt.depth, streamExt.rasterFormat,
	                        PLATFORM_PS2);
	noNewStyleRasters = 0;
	rw::version = oldversion;
	tex->raster = raster;
	natras = GETPS2RASTEREXT(raster);
//printf("%X %X\n", natras->paletteBase, natras->tex1low);
//	printf("%08X%08X %08X%08X %08X%08X\n",
//	       (uint32)natras->tex0, (uint32)(natras->tex0>>32),
//	       (uint32)natras->miptbp1, (uint32)(natras->miptbp1>>32),
//	       (uint32)natras->miptbp2, (uint32)(natras->miptbp2>>32));
//	printTEX0(natras->tex0);
	uint64 tex1;
	calcTEX1(raster, &tex1, tex->filterAddressing & 0xF);
//	printTEX1(tex1);

	// TODO: GTA SA LD_OTB.txd loses here
	assert(natras->pixelSize >= streamExt.pixelSize);
	assert(natras->paletteSize >= streamExt.paletteSize);

//if(natras->tex0 != streamExt.tex0){
//printf("TEX0: %016llX\n      %016llX\n", natras->tex0, streamExt.tex0);
//printTEX0(natras->tex0);
//printTEX0(streamExt.tex0);
//fflush(stdout);
//}
//if(natras->tex1low != streamExt.tex1low)
//printf("TEX1: %08X\n      %08X\n", natras->tex1low, streamExt.tex1low);
//if(natras->miptbp1 != streamExt.miptbp1)
//printf("MIP1: %016llX\n      %016llX\n", natras->miptbp1, streamExt.miptbp1);
//if(natras->miptbp2 != streamExt.miptbp2)
//printf("MIP2: %016llX\n      %016llX\n", natras->miptbp2, streamExt.miptbp2);
//if(natras->paletteBase != streamExt.paletteOffset)
//printf("PAL: %08X\n     %08X\n", natras->paletteBase, streamExt.paletteOffset);
//if(natras->pixelSize != streamExt.pixelSize)
//printf("PXS: %08X\n     %08X\n", natras->pixelSize, streamExt.pixelSize);
//if(natras->paletteSize != streamExt.paletteSize)
//printf("PLS: %08X\n     %08X\n", natras->paletteSize, streamExt.paletteSize);
//if(natras->totalSize != streamExt.totalSize)
//printf("TSZ: %08X\n     %08X\n", natras->totalSize, streamExt.totalSize);

	// junk addresses, no need to store them
	streamExt.tex0 &= ~0x3FFFULL;
	streamExt.tex0 &= ~(0x3FFFULL << 37);

	assert(natras->tex0 == streamExt.tex0);
	natras->tex0 = streamExt.tex0;
	assert(natras->paletteBase == streamExt.paletteOffset);
	natras->paletteBase = streamExt.paletteOffset;
	assert(natras->tex1low == streamExt.tex1low);
	natras->tex1low = streamExt.tex1low;
	assert(natras->miptbp1 == streamExt.miptbp1);
	natras->miptbp1 = streamExt.miptbp1;
	assert(natras->miptbp2 == streamExt.miptbp2);
	natras->miptbp2 = streamExt.miptbp2;
	assert(natras->pixelSize == streamExt.pixelSize);
	natras->pixelSize = streamExt.pixelSize;
	assert(natras->paletteSize == streamExt.paletteSize);
	natras->paletteSize = streamExt.paletteSize;
	assert(natras->totalSize == streamExt.totalSize);
	natras->totalSize = streamExt.totalSize;
	natras->kl = streamExt.mipmapVal;
//printf("%X %X\n", natras->paletteBase, natras->tex1low);
//	printf("%08X%08X %08X%08X %08X%08X\n",
//	       (uint32)natras->tex0, (uint32)(natras->tex0>>32),
//	       (uint32)natras->miptbp1, (uint32)(natras->miptbp1>>32),
//	       (uint32)natras->miptbp2, (uint32)(natras->miptbp2>>32));
//	printTEX0(natras->tex0);
	calcTEX1(raster, &tex1, tex->filterAddressing & 0xF);
//	printTEX1(tex1);

	// this is weird stuff
	if(streamExt.version < 2){
		if(streamExt.version == 1){
			// Version 1 has swizzled 8 bit textures
			if(!(natras->flags & Ps2Raster::NEWSTYLE))
				natras->flags |= Ps2Raster::SWIZZLED8;
			else
				assert(0 && "can't happen");
		}else{
			// Version 0 has no swizzling at all
			if(!(natras->flags & Ps2Raster::NEWSTYLE))
				natras->flags &= ~Ps2Raster::SWIZZLED8;
			else
				assert(0 && "can't happen");
		}
	}

	if(!findChunk(stream, ID_STRUCT, &length, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		goto fail;
	}
	if(streamExt.version < 2){
		stream->read8(raster->pixels, length);
	}else{
		stream->read8(((Ps2Raster::PixelPtr*)raster->originalPixels)->pixels, natras->pixelSize);
		stream->read8(raster->palette-0x50, natras->paletteSize);
	}
//printf("\n");
	return tex;

fail:
	tex->destroy();
	return nil;
}